

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcErrorList.h
# Opt level: O1

void __thiscall
GrcErrorList::AddWarning(GrcErrorList *this,int nID,GdlObject *pgdlobj,string *staMsg)

{
  pointer pcVar1;
  string local_48;
  
  pcVar1 = (staMsg->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + staMsg->_M_string_length);
  AddItem(this,false,nID,pgdlobj,(GrpLineAndFile *)0x0,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void AddWarning(int nID, GdlObject * pgdlobj, std::string staMsg)
	{
		AddItem(false, nID, pgdlobj, NULL, staMsg);
	}